

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O1

string * OGNGetIcaoAcType_abi_cxx11_(FlarmAircraftTy _acTy)

{
  pointer pbVar1;
  ulong uVar2;
  int iVar3;
  pointer pbVar4;
  long lVar5;
  
  uVar2 = (ulong)_acTy;
  if (_acTy < (FAT_AIRSHIP|FAT_TOW_PLANE)) {
    pbVar4 = dataRefs.aFlarmToIcaoAcTy._M_elems[uVar2].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = dataRefs.aFlarmToIcaoAcTy._M_elems[uVar2].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 == pbVar1) {
      pbVar4 = &dataRefs.sDefaultAcIcaoType;
    }
    else {
      lVar5 = (long)pbVar1 - (long)pbVar4;
      if (lVar5 != 0x20) {
        iVar3 = rand();
        pbVar4 = dataRefs.aFlarmToIcaoAcTy._M_elems[uVar2].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (long)((double)(lVar5 >> 5) * (double)iVar3 * 4.656612873077393e-10);
      }
    }
    return pbVar4;
  }
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar2,0xe);
}

Assistant:

const std::string& OGNGetIcaoAcType (FlarmAircraftTy _acTy)
{
    try {
        const std::vector<std::string>& icaoTypes = dataRefs.aFlarmToIcaoAcTy.at(_acTy);
        if (icaoTypes.empty()) return dataRefs.GetDefaultAcIcaoType();
        if (icaoTypes.size() == 1) return icaoTypes.front();
        // more than one type defined, take a random pick
        const size_t i = (size_t)randoml(0, long(icaoTypes.size()) - 1);
        assert(0 <= i && i < icaoTypes.size());
        return icaoTypes[i];
    }
    catch (...) {
        return dataRefs.GetDefaultAcIcaoType();
    }
}